

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O1

REF_STATUS
ref_edge_rcm_queue_node(REF_INT node,REF_INT degree,REF_INT *queue,REF_INT *nqueue,REF_INT *nhere)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = *nhere;
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      if (queue[uVar3 * 2 + 1] < degree) {
        uVar1 = (uint)uVar3;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  iVar2 = *nqueue;
  lVar4 = (long)iVar2;
  if ((int)uVar1 < iVar2) {
    iVar2 = iVar2 * 2;
    do {
      queue[iVar2] = queue[iVar2 + -2];
      queue[iVar2 + 1] = queue[iVar2 + -1];
      lVar4 = lVar4 + -1;
      iVar2 = iVar2 + -2;
    } while ((int)uVar1 < lVar4);
  }
  queue[(int)(uVar1 * 2)] = node;
  iVar2 = uVar1 * 2 + 1;
  queue[iVar2] = degree;
  *nqueue = *nqueue + 1;
  *nhere = *nhere + 1;
  return iVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_edge_rcm_queue_node(REF_INT node, REF_INT degree,
                                                  REF_INT *queue,
                                                  REF_INT *nqueue,
                                                  REF_INT *nhere) {
  REF_INT location, insert_point;

  /* largest degree first, will dequeue smallest from end of array */

  insert_point = *nhere;
  for (location = 0; location < (*nhere); location++) {
    if (queue[1 + 2 * location] < degree) {
      insert_point = location;
      break;
    }
  }

  for (location = (*nqueue); location > insert_point; location--) {
    queue[0 + 2 * location] = queue[0 + 2 * (location - 1)];
    queue[1 + 2 * location] = queue[1 + 2 * (location - 1)];
  }

  queue[0 + 2 * insert_point] = node;
  queue[1 + 2 * insert_point] = degree;
  (*nqueue)++;

  (*nhere)++;

  /*
  printf("nqueue %d of %d (%d) ins %d\n", *nqueue, node, degree, insert_point);
  for (location = 0; location < (*nqueue); location++) {
    printf("%d: %d (%d)\n", location, queue[0 + 2 * location],
           queue[1 + 2 * location]);
  }
  */

  return REF_SUCCESS;
}